

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  int iVar1;
  char *pcVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  ImGuiSettingsHandler *handler;
  ImGuiSettingsHandler *pIVar8;
  size_t size;
  
  pIVar3 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  iVar1 = (pIVar3->SettingsIniData).Buf.Capacity;
  if (iVar1 < 0) {
    uVar7 = iVar1 / 2 + iVar1;
    size = 0;
    if (0 < (int)uVar7) {
      size = (size_t)uVar7;
    }
    pcVar5 = (char *)MemAlloc(size);
    pcVar2 = (pIVar3->SettingsIniData).Buf.Data;
    if (pcVar2 != (char *)0x0) {
      memcpy(pcVar5,pcVar2,(long)(pIVar3->SettingsIniData).Buf.Size);
      MemFree((pIVar3->SettingsIniData).Buf.Data);
    }
    (pIVar3->SettingsIniData).Buf.Data = pcVar5;
    (pIVar3->SettingsIniData).Buf.Capacity = (int)size;
  }
  (pIVar3->SettingsIniData).Buf.Size = 0;
  if ((pIVar3->SettingsIniData).Buf.Capacity == 0) {
    pcVar5 = (char *)MemAlloc(8);
    pcVar2 = (pIVar3->SettingsIniData).Buf.Data;
    if (pcVar2 != (char *)0x0) {
      memcpy(pcVar5,pcVar2,(long)(pIVar3->SettingsIniData).Buf.Size);
      MemFree((pIVar3->SettingsIniData).Buf.Data);
    }
    (pIVar3->SettingsIniData).Buf.Data = pcVar5;
    (pIVar3->SettingsIniData).Buf.Capacity = 8;
  }
  (pIVar3->SettingsIniData).Buf.Data[(pIVar3->SettingsIniData).Buf.Size] = '\0';
  (pIVar3->SettingsIniData).Buf.Size = (pIVar3->SettingsIniData).Buf.Size + 1;
  lVar6 = (long)(pIVar3->SettingsHandlers).Size;
  if (lVar6 != 0) {
    pIVar8 = (pIVar3->SettingsHandlers).Data;
    lVar6 = lVar6 * 0x48;
    do {
      (*pIVar8->WriteAllFn)(pIVar3,pIVar8,&pIVar3->SettingsIniData);
      pIVar8 = pIVar8 + 1;
      lVar6 = lVar6 + -0x48;
    } while (lVar6 != 0);
  }
  if (out_size != (size_t *)0x0) {
    iVar1 = (pIVar3->SettingsIniData).Buf.Size;
    iVar4 = iVar1 + -1;
    if (iVar1 == 0) {
      iVar4 = 0;
    }
    *out_size = (long)iVar4;
  }
  pcVar2 = (pIVar3->SettingsIniData).Buf.Data;
  pcVar5 = ImGuiTextBuffer::EmptyString;
  if (pcVar2 != (char *)0x0) {
    pcVar5 = pcVar2;
  }
  return pcVar5;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        handler.WriteAllFn(&g, &handler, &g.SettingsIniData);
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}